

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTests(UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  TestSuite *this;
  TestInfo *this_00;
  char *pcVar4;
  TestInfo *test_info;
  int j;
  TestSuite *test_suite;
  int i;
  int failed_test_count;
  char *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int iVar5;
  TestResult *this_01;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar6;
  int local_4c;
  int local_40;
  undefined4 local_c;
  
  local_c = UnitTest::failed_test_count((UnitTest *)0x127353);
  uVar6 = 0;
  ColoredPrintf(kRed,"[  FAILED  ] ");
  this_01 = (TestResult *)&stack0xffffffffffffffd0;
  FormatTestCount_abi_cxx11_((int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  uVar3 = std::__cxx11::string::c_str();
  printf("%s, listed below:\n",uVar3);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  local_40 = 0;
  while (iVar5 = local_40, iVar2 = UnitTest::total_test_suite_count((UnitTest *)0x1273c4),
        iVar5 < iVar2) {
    this = UnitTest::GetTestSuite
                     ((UnitTest *)CONCAT44(iVar5,in_stack_ffffffffffffff90),
                      (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    bVar1 = TestSuite::should_run(this);
    if ((bVar1) && (iVar2 = TestSuite::failed_test_count((TestSuite *)0x1273ff), iVar2 != 0)) {
      local_4c = 0;
      while (in_stack_ffffffffffffff90 = local_4c,
            iVar2 = TestSuite::total_test_count((TestSuite *)0x127440),
            in_stack_ffffffffffffff90 < iVar2) {
        this_00 = TestSuite::GetTestInfo
                            ((TestSuite *)CONCAT17(uVar6,in_stack_ffffffffffffffa0),
                             (int)((ulong)this_01 >> 0x20));
        bVar1 = TestInfo::should_run(this_00);
        if (bVar1) {
          TestInfo::result(this_00);
          bVar1 = TestResult::Failed(this_01);
          if (bVar1) {
            ColoredPrintf(kRed,"[  FAILED  ] ");
            in_stack_ffffffffffffff88 = TestSuite::name((TestSuite *)0x1274a6);
            pcVar4 = TestInfo::name((TestInfo *)0x1274b4);
            printf("%s.%s",in_stack_ffffffffffffff88,pcVar4);
            PrintFullTestCommentIfPresent((TestInfo *)CONCAT44(iVar5,in_stack_ffffffffffffff90));
            printf("\n");
          }
        }
        local_4c = local_4c + 1;
      }
    }
    local_40 = local_40 + 1;
  }
  pcVar4 = "TESTS";
  if (local_c == 1) {
    pcVar4 = "TEST";
  }
  printf("\n%2d FAILED %s\n",(ulong)(uint)local_c,pcVar4);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTests(const UnitTest& unit_test) {
  const int failed_test_count = unit_test.failed_test_count();
  ColoredPrintf(GTestColor::kRed, "[  FAILED  ] ");
  printf("%s, listed below:\n", FormatTestCount(failed_test_count).c_str());

  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    const TestSuite& test_suite = *unit_test.GetTestSuite(i);
    if (!test_suite.should_run() || (test_suite.failed_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_suite.total_test_count(); ++j) {
      const TestInfo& test_info = *test_suite.GetTestInfo(j);
      if (!test_info.should_run() || !test_info.result()->Failed()) {
        continue;
      }
      ColoredPrintf(GTestColor::kRed, "[  FAILED  ] ");
      printf("%s.%s", test_suite.name(), test_info.name());
      PrintFullTestCommentIfPresent(test_info);
      printf("\n");
    }
  }
  printf("\n%2d FAILED %s\n", failed_test_count,
         failed_test_count == 1 ? "TEST" : "TESTS");
}